

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_server_main.cpp
# Opt level: O0

void __thiscall settings::settings(settings *this,int argc,char **argv)

{
  uint in_ESI;
  string *in_RDI;
  string *this_00;
  string *other;
  cppcms_error *anon_var_0;
  value *in_stack_00000368;
  settings *in_stack_00000370;
  undefined1 local_30 [36];
  uint local_c;
  
  local_c = in_ESI;
  std::__cxx11::string::string(in_RDI);
  cppcms::json::value::value((value *)0x109c8c);
  this_00 = in_RDI + 0x38;
  std::shared_ptr<cppcms::sessions::session_storage_factory>::shared_ptr
            ((shared_ptr<cppcms::sessions::session_storage_factory> *)0x109ca1);
  booster::shared_object::shared_object((shared_object *)(in_RDI + 0x48));
  other = in_RDI + 0x50;
  booster::intrusive_ptr<cppcms::impl::base_cache>::intrusive_ptr
            ((intrusive_ptr<cppcms::impl::base_cache> *)other);
  cppcms::service::load_settings((int)local_30,(char **)(ulong)local_c);
  cppcms::json::value::operator=((value *)this_00,(value *)other);
  cppcms::json::value::~value((value *)0x109cfe);
  setup(in_stack_00000370,in_stack_00000368);
  return;
}

Assistant:

settings(int argc,char **argv)
	{
		try {
			config = cppcms::service::load_settings(argc,argv);
			setup(config);
		}
		catch(cppcms::cppcms_error const &) {
			help();
			throw;
		}
	}